

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O2

Pixmap __thiscall
Am_Image_Array_Data::Safe_Get_X_Pixmap(Am_Image_Array_Data *this,Am_Drawonable_Impl *draw)

{
  Display *display;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Am_Generic_Image *pAVar4;
  ostream *poVar5;
  Pixmap bitmap;
  int n_cols;
  XColor *cols;
  uint h;
  uint w;
  
  display = draw->screen->display;
  if (display == this->main_display) {
    return this->main_bitmap;
  }
  bVar2 = Get_Bitmap(this,display,&bitmap);
  if (bVar2) {
    return bitmap;
  }
  cols = (XColor *)0x0;
  n_cols = 0;
  pcVar1 = this->name;
  if (pcVar1 != (char *)0x0) {
    bVar2 = is_gif(this);
    if (bVar2) {
      bVar2 = make_generic_image_from_name(this);
      if (!bVar2) {
        return 0;
      }
      bitmap = Make_Pixmap_From_Generic_Image(this,draw,&cols,&n_cols);
    }
    else {
      iVar3 = XReadBitmapFile(display,draw->xlib_drawable,pcVar1,&w,&h,&bitmap,&this->x_hot,
                              &this->y_hot);
      pAVar4 = (Am_Generic_Image *)operator_new(0x20);
      (pAVar4->iminfo).width = (unsigned_short)w;
      (pAVar4->iminfo).height = (unsigned_short)h;
      (pAVar4->iminfo).depth = 1;
      (pAVar4->iminfo).num_colors = 0;
      (pAVar4->iminfo).transparent = false;
      *(undefined2 *)((long)&pAVar4->imdata + 6) = 0;
      *(undefined8 *)&(pAVar4->iminfo).raw_transparent_color_index = 0;
      *(undefined8 *)((long)&pAVar4->color_map + 6) = 0;
      this->image_ = pAVar4;
      if (iVar3 != 0) {
        return 0;
      }
    }
LAB_00277e1b:
    if (this->main_display == (Display *)0x0) {
      this->main_display = display;
      this->main_bitmap = bitmap;
      this->colors = cols;
      this->num_colors = n_cols;
    }
    else {
      Add_Bitmap(this,display,bitmap,cols,n_cols);
    }
    return bitmap;
  }
  pAVar4 = this->image_;
  bitmap = XCreateBitmapFromData
                     (display,draw->xlib_drawable,pAVar4->imdata,(pAVar4->iminfo).width,
                      (pAVar4->iminfo).height);
  if (bitmap == 9) {
    pcVar1 = "** Bitmap Error: Bad Drawable error";
  }
  else {
    if (bitmap != 0xb) goto LAB_00277e1b;
    pcVar1 = "** Bitmap Error: Bad Alloc error";
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,pcVar1 + 0x11);
  std::endl<char,std::char_traits<char>>(poVar5);
  Am_Error();
}

Assistant:

Pixmap
Am_Image_Array_Data::Safe_Get_X_Pixmap(const Am_Drawonable_Impl *draw)
{
  Display *disp = draw->screen->display;
  if (disp == main_display)
    return main_bitmap;

  Pixmap bitmap;

  if (Get_Bitmap(disp, bitmap))
    return bitmap;

  XColor *cols = nullptr;
  int n_cols = 0;

  /* then we need to read it in or make it */
  if (name) {
    unsigned int w, h;

    /* read image rom a file */

    if (is_gif()) {
      if (!make_generic_image_from_name())
        return 0;
      bitmap = Make_Pixmap_From_Generic_Image(draw, cols, n_cols);
    } else { // it's an xbm
      int tmp = XReadBitmapFile(disp, draw->xlib_drawable, name, &w, &h,
                                &bitmap, &x_hot, &y_hot);
      // fill an empty structure to store width, height in.
      image_ = new Am_Generic_Image(nullptr, w, h, 1);
      if (tmp != BitmapSuccess)
        return 0;
    } // else bmp format
  } else {
    // then we need to make it from data
    // Assume that it's in XYBitmap format in the generic image item.
    unsigned short int width, height;
    image_->Get_Size(width, height);
    bitmap = XCreateBitmapFromData(disp, draw->xlib_drawable,
                                   (char *)image_->Get_Data(), width, height);

    if (bitmap == BadAlloc) {
      std::cerr << "Bad Alloc error" << std::endl;
      Am_Error();
    }
    if (bitmap == BadDrawable) {
      std::cerr << "Bad Drawable error" << std::endl;
      Am_Error();
    }
  }

  if (main_display)
    Add_Bitmap(disp, bitmap, cols, n_cols);
  else {
    main_display = disp;
    main_bitmap = bitmap;
    colors = cols;
    num_colors = n_cols;
  }
  return bitmap;
}